

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void WriteStringToFile(FILE *file_ptr,string *str)

{
  byte bVar1;
  ostream *poVar2;
  ulong uVar3;
  ostream *poVar4;
  long in_RDI;
  size_t len;
  size_t in_stack_00000110;
  char *in_stack_00000118;
  FILE *in_stack_00000120;
  Logger *in_stack_fffffffffffffea0;
  string *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int line;
  string *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  allocator *paVar5;
  LogSeverity severity;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14 [5];
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (in_RDI == 0) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_39);
    paVar5 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"WriteStringToFile",paVar5);
    poVar2 = Logger::Start((LogSeverity)((ulong)paVar5 >> 0x20),in_stack_ffffffffffffff18,line,
                           in_stack_ffffffffffffff08);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x129);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file_ptr");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffea0);
    abort();
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::size();
    WriteDataToDisk(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    std::__cxx11::string::data();
    WriteDataToDisk(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    return;
  }
  Logger::Logger(&local_78,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
             ,&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"WriteStringToFile",&local_c1);
  poVar2 = Logger::Start(severity,in_stack_ffffffffffffff18,line,in_stack_ffffffffffffff08);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,299);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"!str.empty()");
  poVar4 = std::operator<<(poVar2," = ");
  bVar1 = std::__cxx11::string::empty();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(bVar1 ^ 1));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Logger::~Logger((Logger *)poVar2);
  abort();
}

Assistant:

inline void WriteStringToFile(FILE * file_ptr, const std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty string
  CHECK(!str.empty());
  size_t len =str.size();
  // First, write the length of string
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of string
  WriteDataToDisk(file_ptr, const_cast<char *>(str.data()), len);
}